

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

void __thiscall
soul::AST::ArrayElementRef::ArrayElementRef
          (ArrayElementRef *this,Context *c,Expression *o,pool_ptr<soul::AST::Expression> *start,
          pool_ptr<soul::AST::Expression> *end,bool slice)

{
  SourceCodeText *pSVar1;
  
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__ASTObject_00301658;
  (this->super_Expression).super_Statement.super_ASTObject.objectType = ArrayElementRef;
  pSVar1 = (c->location).sourceCode.object;
  (this->super_Expression).super_Statement.super_ASTObject.context.location.sourceCode.object =
       pSVar1;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  (this->super_Expression).super_Statement.super_ASTObject.context.location.location.data =
       (c->location).location.data;
  (this->super_Expression).super_Statement.super_ASTObject.context.parentScope = c->parentScope;
  (this->super_Expression).kind = value;
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__ArrayElementRef_00301e28;
  (this->object).object = o;
  (this->startIndex).object = start->object;
  (this->endIndex).object = end->object;
  this->isSlice = slice;
  this->suppressWrapWarning = false;
  return;
}

Assistant:

ASTObject (ObjectType ot, const Context& c) : objectType (ot), context (c) {}